

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

bool __thiscall VCCluster::removeUnconnected(VCCluster *this,VCCluster *cNull)

{
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *this_00;
  VCFace *f;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar4;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **ppsVar5;
  ulong uVar6;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  *__range1;
  iterator iVar7;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *__range3;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *this_01;
  iterator __begin1;
  vector<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*,_std::allocator<std::set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>_*>_>
  components;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *comp;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> unvisited;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_a8;
  iterator iStack_a0;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_98;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *local_88;
  ulong local_80;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  *local_78;
  set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **local_70;
  VCCluster *local_68;
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  local_60;
  
  local_a8 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  iStack_a0._M_current = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  local_98 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0;
  local_68 = cNull;
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::_Rb_tree(&local_60,&(this->items)._M_t);
  if (local_60._M_impl.super__Rb_tree_header._M_node_count != 0) {
    do {
      local_88 = (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)operator_new(0x30)
      ;
      p_Var3 = &(local_88->_M_t)._M_impl.super__Rb_tree_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(local_88->_M_t)._M_impl = 0;
      *(undefined8 *)&(local_88->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var3->_M_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var3->_M_header;
      (local_88->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      bfs(this,*(VCFace **)(local_60._M_impl.super__Rb_tree_header._M_header._M_left + 1),local_88,
          (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> *)&local_60);
      if (iStack_a0._M_current == local_98) {
        std::
        vector<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*,std::allocator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*>>
        ::_M_realloc_insert<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*const&>
                  ((vector<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*,std::allocator<std::set<VCFace*,std::less<VCFace*>,std::allocator<VCFace*>>*>>
                    *)&local_a8,iStack_a0,&local_88);
      }
      else {
        *iStack_a0._M_current = local_88;
        iStack_a0._M_current = iStack_a0._M_current + 1;
      }
    } while (local_60._M_impl.super__Rb_tree_header._M_node_count != 0);
  }
  uVar6 = (long)iStack_a0._M_current - (long)local_a8;
  if (uVar6 < 9) {
    if (uVar6 != 8) goto LAB_00112a85;
    this_01 = &(*local_a8)->_M_t;
  }
  else {
    ppsVar1 = local_a8 + 1;
    ppsVar4 = local_a8;
    ppsVar5 = local_a8;
    if (ppsVar1 != iStack_a0._M_current && local_a8 != iStack_a0._M_current) {
      do {
        ppsVar4 = ppsVar1;
        if (((*ppsVar1)->_M_t)._M_impl.super__Rb_tree_header._M_node_count <=
            ((*ppsVar5)->_M_t)._M_impl.super__Rb_tree_header._M_node_count) {
          ppsVar4 = ppsVar5;
        }
        ppsVar1 = ppsVar1 + 1;
        ppsVar5 = ppsVar4;
      } while (ppsVar1 != iStack_a0._M_current);
    }
    this_01 = &(*ppsVar4)->_M_t;
    local_80 = uVar6;
    if (local_a8 != iStack_a0._M_current) {
      local_70 = iStack_a0._M_current;
      iVar7._M_current = iStack_a0._M_current;
      ppsVar1 = local_a8;
      local_78 = this_01;
      do {
        this_00 = &(*ppsVar1)->_M_t;
        if (this_00 != this_01) {
          for (p_Var2 = (this_00->_M_impl).super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var2 != &(this_00->_M_impl).super__Rb_tree_header;
              p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
            f = *(VCFace **)(p_Var2 + 1);
            delItem(this,f);
            addItem(local_68,f);
          }
          std::
          _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
          ::~_Rb_tree(this_00);
          operator_delete(this_00);
          iVar7._M_current = local_70;
          this_01 = local_78;
        }
        ppsVar1 = ppsVar1 + 1;
        uVar6 = local_80;
      } while (ppsVar1 != iVar7._M_current);
    }
  }
  if (this_01 !=
      (_Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
       *)0x0) {
    std::
    _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
    ::~_Rb_tree(this_01);
    operator_delete(this_01);
  }
LAB_00112a85:
  std::
  _Rb_tree<VCFace_*,_VCFace_*,_std::_Identity<VCFace_*>,_std::less<VCFace_*>,_std::allocator<VCFace_*>_>
  ::~_Rb_tree(&local_60);
  if (local_a8 != (set<VCFace_*,_std::less<VCFace_*>,_std::allocator<VCFace_*>_> **)0x0) {
    operator_delete(local_a8);
  }
  return 8 < uVar6;
}

Assistant:

bool VCCluster::removeUnconnected(VCCluster* cNull) {
	vector< set<VCFace*> * > components;
	set<VCFace*> unvisited(items);
	while (!unvisited.empty()) {
		set<VCFace*>* comp = new set<VCFace*>();
		bfs(*unvisited.begin(), comp, &unvisited);
		components.push_back(comp);
	}
	if (components.size() <= 1) {
		if(components.size() == 1)
			delete components[0];
		return false;
	}
	set<VCFace*>* largest = *max_element(components.begin(), components.end(),
		[](set<VCFace*> * s1, set<VCFace*> * s2) -> bool { return s1->size() < s2->size(); });
	for (set<VCFace*>* s : components) {
		if (s != largest) {
			for (VCFace* item : *s) {
				giveItem(item, cNull);
			}
			delete s;
		}
	}
	delete largest;
	return true;
}